

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

uint16_t __thiscall
icu_63::Normalizer2Impl::previousFCD16(Normalizer2Impl *this,UChar *start,UChar **s)

{
  UChar *pUVar1;
  UBool UVar2;
  uint local_2c;
  UChar c2;
  UChar32 c;
  UChar **s_local;
  UChar *start_local;
  Normalizer2Impl *this_local;
  
  pUVar1 = *s;
  *s = pUVar1 + -1;
  local_2c = (uint)(ushort)pUVar1[-1];
  if (local_2c < (ushort)this->minDecompNoCP) {
    this_local._6_2_ = 0;
  }
  else {
    if ((local_2c & 0xfffffc00) == 0xdc00) {
      if ((start < *s) && (((*s)[-1] & 0xfc00U) == 0xd800)) {
        local_2c = (uint)(ushort)(*s)[-1] * 0x400 + local_2c + 0xfca02400;
        *s = *s + -1;
      }
    }
    else {
      UVar2 = singleLeadMightHaveNonZeroFCD16(this,local_2c);
      if (UVar2 == '\0') {
        return 0;
      }
    }
    this_local._6_2_ = getFCD16FromNormData(this,local_2c);
  }
  return this_local._6_2_;
}

Assistant:

uint16_t previousFCD16(const UChar *start, const UChar *&s) const {
        UChar32 c=*--s;
        if(c<minDecompNoCP) {
            return 0;
        }
        if(!U16_IS_TRAIL(c)) {
            if(!singleLeadMightHaveNonZeroFCD16(c)) {
                return 0;
            }
        } else {
            UChar c2;
            if(start<s && U16_IS_LEAD(c2=*(s-1))) {
                c=U16_GET_SUPPLEMENTARY(c2, c);
                --s;
            }
        }
        return getFCD16FromNormData(c);
    }